

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

void __thiscall
v_hashmap<substring,_unsigned_long>::put_after_get
          (v_hashmap<substring,_unsigned_long> *this,substring *key,uint64_t hash,unsigned_long *val
          )

{
  hash_elem *phVar1;
  v_hashmap<substring,_unsigned_long> *this_00;
  v_hashmap<substring,_unsigned_long> *pvVar2;
  unsigned_long *in_RDX;
  uint64_t in_RSI;
  substring *in_RDI;
  v_hashmap<substring,_unsigned_long> *unaff_retaddr;
  uint64_t in_stack_000001a8;
  substring *in_stack_000001b0;
  v_hashmap<substring,_unsigned_long> *in_stack_000001b8;
  substring *key_00;
  
  key_00 = in_RDI;
  phVar1 = v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::operator[]
                     ((v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *)&in_RDI[1].end,
                      (size_t)in_RDI[3].end);
  if ((phVar1->occupied & 1U) == 0) {
    in_RDI[4].begin = in_RDI[4].begin + 1;
    this_00 = (v_hashmap<substring,_unsigned_long> *)((long)in_RDI[4].begin << 2);
    pvVar2 = (v_hashmap<substring,_unsigned_long> *)base_size(this_00);
    if (pvVar2 <= this_00) {
      double_size((v_hashmap<substring,_unsigned_long> *)hash);
      get(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8);
    }
  }
  put_after_get_nogrow(unaff_retaddr,key_00,in_RSI,in_RDX);
  return;
}

Assistant:

void put_after_get(const K& key, uint64_t hash, const V& val)
  {
    if (!dat[last_position].occupied)
    {
      num_occupants++;
      if (num_occupants * 4 >= base_size())  // grow when we're a quarter full
      {
        double_size();
        get(key, hash);  // probably should change last_position-- this is the lazy man's way to do it
      }
    }

    // now actually insert it
    put_after_get_nogrow(key, hash, val);
  }